

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_statistics.h
# Opt level: O2

string * __thiscall
embree::BVHNStatistics<4>::Statistics::LeafStat::toString_abi_cxx11_
          (string *__return_storage_ptr__,LeafStat *this,BVH *bvh,double sahTotal,size_t bytesTotal)

{
  size_t sVar1;
  size_t sVar2;
  ostream *poVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ostringstream stream;
  long local_1a0 [3];
  uint auStack_188 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xfffffefb | 4;
  poVar3 = std::operator<<((ostream *)local_1a0,"sah = ");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 7;
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 8) = 3;
  dVar4 = sah(this,bvh);
  std::ostream::_M_insert<double>(dVar4);
  poVar3 = std::operator<<((ostream *)local_1a0," (");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 6;
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 8) = 2;
  dVar4 = sah(this,bvh);
  poVar3 = std::ostream::_M_insert<double>((dVar4 * 100.0) / sahTotal);
  std::operator<<(poVar3,"%), ");
  poVar3 = std::operator<<((ostream *)local_1a0,"#bytes = ");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 7;
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 8) = 2;
  auVar5._0_8_ = (double)CONCAT44(0x43300000,(int)this->numBytes);
  auVar5._8_4_ = (int)(this->numBytes >> 0x20);
  auVar5._12_4_ = 0x45300000;
  poVar3 = std::ostream::_M_insert<double>
                     (((auVar5._8_8_ - 1.9342813113834067e+25) + (auVar5._0_8_ - 4503599627370496.0)
                      ) / 1000000.0);
  std::operator<<(poVar3," MB ");
  poVar3 = std::operator<<((ostream *)local_1a0,"(");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 6;
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 8) = 2;
  sVar1 = this->numBytes;
  auVar6._8_4_ = (int)(sVar1 >> 0x20);
  auVar6._0_8_ = sVar1;
  auVar6._12_4_ = 0x45300000;
  auVar7._8_4_ = (int)(bytesTotal >> 0x20);
  auVar7._0_8_ = bytesTotal;
  auVar7._12_4_ = 0x45300000;
  poVar3 = std::ostream::_M_insert<double>
                     ((((auVar6._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 100.0) /
                      ((auVar7._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)bytesTotal) - 4503599627370496.0)));
  std::operator<<(poVar3,"%), ");
  poVar3 = std::operator<<((ostream *)local_1a0,"#nodes = ");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 7;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," (");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 6;
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 8) = 2;
  sVar1 = this->numPrimsActive;
  auVar8._8_4_ = (int)(sVar1 >> 0x20);
  auVar8._0_8_ = sVar1;
  auVar8._12_4_ = 0x45300000;
  sVar2 = this->numPrimsTotal;
  auVar9._8_4_ = (int)(sVar2 >> 0x20);
  auVar9._0_8_ = sVar2;
  auVar9._12_4_ = 0x45300000;
  poVar3 = std::ostream::_M_insert<double>
                     ((((auVar8._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) /
                      ((auVar9._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0))) * 100.0);
  std::operator<<(poVar3,"% filled), ");
  poVar3 = std::operator<<((ostream *)local_1a0,"#bytes/prim = ");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 6;
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 8) = 2;
  sVar1 = this->numBytes;
  auVar10._8_4_ = (int)(sVar1 >> 0x20);
  auVar10._0_8_ = sVar1;
  auVar10._12_4_ = 0x45300000;
  sVar2 = bvh->numPrimitives;
  auVar11._8_4_ = (int)(sVar2 >> 0x20);
  auVar11._0_8_ = sVar2;
  auVar11._12_4_ = 0x45300000;
  std::ostream::_M_insert<double>
            (((auVar10._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) /
             ((auVar11._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)));
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(BVH* bvh, double sahTotal, size_t bytesTotal) const
        {
          std::ostringstream stream;
          stream.setf(std::ios::fixed, std::ios::floatfield);
          stream << "sah = " << std::setw(7) << std::setprecision(3) << sah(bvh);
          stream << " (" << std::setw(6) << std::setprecision(2) << 100.0*sah(bvh)/sahTotal << "%), ";
          stream << "#bytes = " << std::setw(7) << std::setprecision(2) << double(bytes(bvh))/1E6  << " MB ";
          stream << "(" << std::setw(6) << std::setprecision(2) << 100.0*double(bytes(bvh))/double(bytesTotal) << "%), ";
          stream << "#nodes = " << std::setw(7) << numLeaves << " (" << std::setw(6) << std::setprecision(2) << 100.0*fillRate(bvh) << "% filled), ";
          stream << "#bytes/prim = " << std::setw(6) << std::setprecision(2) << double(bytes(bvh))/double(bvh->numPrimitives);
          return stream.str();
        }